

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::BasicNoBindingLayout::Run(BasicNoBindingLayout *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint GVar2;
  GLuint GVar3;
  long lStack_50;
  int data;
  char *glsl_vs;
  
  bVar1 = ShaderStorageBufferObjectBase::SupportedInVS(&this->super_ShaderStorageBufferObjectBase,3)
  ;
  if (bVar1) {
    glsl_vs = 
    "#version 430 core\nlayout(std430) buffer Output0 { int data; } g_output0;\nlayout(std430) buffer Output1 { int g_output1; };\nlayout(std430) buffer Output2 { int data; } g_output2;\nvoid main() {\n  g_output0.data = 1;\n  g_output1 = 2;\n  g_output2.data = 3;\n}"
    ;
    this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    GVar2 = glu::CallLogWrapper::glCreateShaderProgramv(this_00,0x8b31,1,&glsl_vs);
    this->m_vsp = GVar2;
    bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,GVar2);
    if (bVar1) {
      glu::CallLogWrapper::glUseProgramStages(this_00,this->m_ppo,1,this->m_vsp);
      GVar2 = this->m_vsp;
      GVar3 = glu::CallLogWrapper::glGetProgramResourceIndex(this_00,GVar2,0x92e6,"Output0");
      glu::CallLogWrapper::glShaderStorageBlockBinding(this_00,GVar2,GVar3,1);
      GVar2 = this->m_vsp;
      GVar3 = glu::CallLogWrapper::glGetProgramResourceIndex(this_00,GVar2,0x92e6,"Output1");
      glu::CallLogWrapper::glShaderStorageBlockBinding(this_00,GVar2,GVar3,5);
      GVar2 = this->m_vsp;
      GVar3 = glu::CallLogWrapper::glGetProgramResourceIndex(this_00,GVar2,0x92e6,"Output2");
      glu::CallLogWrapper::glShaderStorageBlockBinding(this_00,GVar2,GVar3,7);
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_ssbo);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x400,(void *)0x0,0x88e8);
      glu::CallLogWrapper::glBindBufferRange(this_00,0x90d2,1,this->m_ssbo,0,4);
      glu::CallLogWrapper::glBindBufferRange(this_00,0x90d2,5,this->m_ssbo,0x100,4);
      glu::CallLogWrapper::glBindBufferRange(this_00,0x90d2,7,this->m_ssbo,0x200,4);
      glu::CallLogWrapper::glEnable(this_00,0x8c89);
      glu::CallLogWrapper::glBindProgramPipeline(this_00,this->m_ppo);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
      glu::CallLogWrapper::glDrawArrays(this_00,0,0,1);
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_ssbo);
      glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
      glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,4,&data);
      lStack_50 = -1;
      if ((data == 1) &&
         (glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0x100,4,&data), data == 2)) {
        glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0x200,4,&data);
        lStack_50 = -(ulong)(data != 3);
      }
    }
    else {
      lStack_50 = -1;
    }
  }
  else {
    lStack_50 = 0x10;
  }
  return lStack_50;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(3))
			return NOT_SUPPORTED;

		const char* const glsl_vs = "#version 430 core" NL "layout(std430) buffer Output0 { int data; } g_output0;" NL
									"layout(std430) buffer Output1 { int g_output1; };" NL
									"layout(std430) buffer Output2 { int data; } g_output2;" NL "void main() {" NL
									"  g_output0.data = 1;" NL "  g_output1 = 2;" NL "  g_output2.data = 3;" NL "}";
		m_vsp = glCreateShaderProgramv(GL_VERTEX_SHADER, 1, &glsl_vs);
		if (!CheckProgram(m_vsp))
			return ERROR;
		glUseProgramStages(m_ppo, GL_VERTEX_SHADER_BIT, m_vsp);

		glShaderStorageBlockBinding(m_vsp, glGetProgramResourceIndex(m_vsp, GL_SHADER_STORAGE_BLOCK, "Output0"), 1);
		glShaderStorageBlockBinding(m_vsp, glGetProgramResourceIndex(m_vsp, GL_SHADER_STORAGE_BLOCK, "Output1"), 5);
		glShaderStorageBlockBinding(m_vsp, glGetProgramResourceIndex(m_vsp, GL_SHADER_STORAGE_BLOCK, "Output2"), 7);

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_ssbo);
		glBufferData(GL_SHADER_STORAGE_BUFFER, 1024, NULL, GL_DYNAMIC_DRAW);
		glBindBufferRange(GL_SHADER_STORAGE_BUFFER, 1, m_ssbo, 0, 4);
		glBindBufferRange(GL_SHADER_STORAGE_BUFFER, 5, m_ssbo, 256, 4);
		glBindBufferRange(GL_SHADER_STORAGE_BUFFER, 7, m_ssbo, 512, 4);

		glEnable(GL_RASTERIZER_DISCARD);
		glBindProgramPipeline(m_ppo);
		glBindVertexArray(m_vao);
		glDrawArrays(GL_POINTS, 0, 1);

		int data;
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_ssbo);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, 4, &data);
		if (data != 1)
			return ERROR;
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 256, 4, &data);
		if (data != 2)
			return ERROR;
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 512, 4, &data);
		if (data != 3)
			return ERROR;

		return NO_ERROR;
	}